

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

const_local_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::end(const_local_iterator *__return_storage_ptr__,
     sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
     *this,size_type i)

{
  bool bVar1;
  uint uVar2;
  
  begin(__return_storage_ptr__,this,i);
  uVar2 = (int)i + (int)(i / 0x30) * -0x30;
  if (((this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start[i / 0x30].bitmap[uVar2 >> 3] >> (uVar2 & 7) & 1) !=
      0) {
    bVar1 = test_deleted(this,i);
    if (!bVar1) {
      const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::operator++(&__return_storage_ptr__->pos);
      sparse_hashtable_const_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_deleted(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const_local_iterator end(size_type i) const {
    const_local_iterator it = begin(i);
    if (table.test(i) && !test_deleted(i)) ++it;
    return it;
  }